

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeSetMaxStep(void *cvode_mem,sunrealtype hmax)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x15e;
  }
  else {
    if (0.0 <= hmax) {
      if ((hmax != 0.0) || (NAN(hmax))) {
        if (1.0 < *(double *)((long)cvode_mem + 0x2e8) * (1.0 / hmax)) {
          msgfmt = "Inconsistent step size limits: hmin > hmax.";
          error_code = -0x16;
          line = 0x175;
          goto LAB_001120f3;
        }
        *(double *)((long)cvode_mem + 0x2f0) = 1.0 / hmax;
      }
      else {
        *(undefined8 *)((long)cvode_mem + 0x2f0) = 0;
      }
      return 0;
    }
    msgfmt = "hmax < 0 illegal.";
    error_code = -0x16;
    line = 0x166;
  }
LAB_001120f3:
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSetMaxStep",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeSetMaxStep(void* cvode_mem, sunrealtype hmax)
{
  sunrealtype hmax_inv;
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (hmax < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NEG_HMAX);
    return (CV_ILL_INPUT);
  }

  /* Passing 0 sets hmax = infinity */
  if (hmax == ZERO)
  {
    cv_mem->cv_hmax_inv = HMAX_INV_DEFAULT;
    return (CV_SUCCESS);
  }

  hmax_inv = ONE / hmax;
  if (hmax_inv * cv_mem->cv_hmin > ONE)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_HMIN_HMAX);
    return (CV_ILL_INPUT);
  }

  cv_mem->cv_hmax_inv = hmax_inv;

  return (CV_SUCCESS);
}